

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O0

CBuildVisitor * __thiscall
CBuildVisitor::GetMethodFullName(CBuildVisitor *this,string *className,string *methodName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [40];
  string *methodName_local;
  string *className_local;
  CBuildVisitor *this_local;
  
  methodName_local = methodName;
  className_local = className;
  this_local = this;
  std::operator+(local_48,(char *)methodName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,local_48)
  ;
  std::__cxx11::string::~string((string *)local_48);
  return this;
}

Assistant:

std::string CBuildVisitor::GetMethodFullName( const std::string &className, const std::string &methodName ) {
    return className + "$$" + methodName;
}